

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

bool __thiscall ON_Matrix::IsColOrthoNormal(ON_Matrix *this)

{
  uint uVar1;
  bool bVar2;
  double ***pppdVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  bVar2 = IsColOrthoganal(this);
  uVar1 = this->m_row_count;
  pppdVar3 = &this->m;
  if (uVar1 == (this->m_rowmem).m_count) {
    pppdVar3 = &(this->m_rowmem).m_a;
  }
  if ((bVar2) && (0 < (long)this->m_col_count)) {
    lVar4 = 0;
    do {
      dVar6 = 0.0;
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          dVar6 = dVar6 + (*pppdVar3)[uVar5][lVar4] * (*pppdVar3)[uVar5][lVar4];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      if (1.490116119385e-08 <= ABS(1.0 - dVar6)) {
        bVar2 = false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != this->m_col_count);
  }
  return bVar2;
}

Assistant:

bool ON_Matrix::IsColOrthoNormal() const
{
  double d;
  int i, j;
  bool rc = IsColOrthoganal();
  double const*const* this_m = ThisM();
  if ( rc ) {
    for ( j = 0; j < m_col_count; j++ ) {
      d = 0.0;
      for ( i = 0; i < m_row_count; i++ ) {
        d += this_m[i][j]*this_m[i][j];
      }
      if ( fabs(1.0-d) >=  ON_SQRT_EPSILON )
        rc = false;
    }
  }
  return rc;
}